

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void changeLpMatrixCoefficient
               (HighsLp *lp,HighsInt row,HighsInt col,double new_value,bool zero_new_value)

{
  vector<int,_std::allocator<int>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  
  lVar9 = (long)col;
  piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = piVar2[lVar9];
  uVar4 = piVar2[lVar9 + 1];
  uVar5 = 0xffffffff;
  if ((int)uVar6 < (int)uVar4) {
    piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (int)uVar6;
    do {
      if (*piVar7 == row) {
        uVar5 = (ulong)uVar6;
        break;
      }
      uVar6 = uVar6 + 1;
      piVar7 = piVar7 + 1;
    } while (uVar4 != uVar6);
  }
  uVar6 = (uint)uVar5;
  if ((int)uVar6 < 0) {
    if (zero_new_value) {
      return;
    }
    iVar1 = piVar2[lp->num_col_];
    lVar8 = (long)iVar1;
    this = &(lp->a_matrix_).index_;
    std::vector<int,_std::allocator<int>_>::resize(this,lVar8 + 1U);
    this_00 = &(lp->a_matrix_).value_;
    std::vector<double,_std::allocator<double>_>::resize(this_00,lVar8 + 1U);
    if (col < lp->num_col_) {
      piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        piVar7 = piVar2 + lVar9 + 1;
        *piVar7 = *piVar7 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < lp->num_col_);
    }
    if ((int)uVar4 < iVar1) {
      piVar2 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        piVar2[lVar8] = piVar2[lVar8 + -1];
        pdVar3[lVar8] = pdVar3[lVar8 + -1];
        lVar8 = lVar8 + -1;
      } while ((int)uVar4 < lVar8);
    }
  }
  else {
    uVar4 = uVar6;
    if (zero_new_value) {
      iVar1 = piVar2[lp->num_col_];
      if (col < lp->num_col_) {
        do {
          piVar2[lVar9 + 1] = piVar2[lVar9 + 1] + -1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < lp->num_col_);
      }
      if (iVar1 + -1 <= (int)uVar6) {
        return;
      }
      piVar2 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        piVar2[uVar5 + lVar9] = piVar2[uVar5 + lVar9 + 1];
        pdVar3[uVar5 + lVar9] = pdVar3[uVar5 + lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while ((int)(uVar6 + (int)lVar9) < iVar1 + -1);
      return;
    }
  }
  (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[(int)uVar4] = row;
  (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[(int)uVar4] = new_value;
  return;
}

Assistant:

void changeLpMatrixCoefficient(HighsLp& lp, const HighsInt row,
                               const HighsInt col, const double new_value,
                               const bool zero_new_value) {
  assert(0 <= row && row < lp.num_row_);
  assert(0 <= col && col < lp.num_col_);

  // Determine whether the coefficient corresponds to an existing
  // nonzero
  HighsInt change_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[col];
       el < lp.a_matrix_.start_[col + 1]; el++) {
    if (lp.a_matrix_.index_[el] == row) {
      change_el = el;
      break;
    }
  }
  if (change_el < 0) {
    // Coefficient doesn't correspond to an existing nonzero
    //
    // If coefficient is small, then just ignore it
    if (zero_new_value) return;
    // New nonzero goes at the end of column "col", so have to shift
    // all index and value entries forward by 1 to accommodate it
    change_el = lp.a_matrix_.start_[col + 1];
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] + 1;
    lp.a_matrix_.index_.resize(new_num_nz);
    lp.a_matrix_.value_.resize(new_num_nz);
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]++;
    for (HighsInt el = new_num_nz - 1; el > change_el; el--) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el - 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el - 1];
    }
  } else if (zero_new_value) {
    // Coefficient zeroes an existing nonzero, so shift all index and
    // value entries backward by 1 to eliminate it
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] - 1;
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]--;
    for (HighsInt el = change_el; el < new_num_nz; el++) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el + 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el + 1];
    }
    return;
  }
  lp.a_matrix_.index_[change_el] = row;
  lp.a_matrix_.value_[change_el] = new_value;
}